

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::tab_r::qf2(tab_r *this,float_t u,float_t qf1,float_t zi)

{
  uint uVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  float local_28;
  
  fVar4 = 0.0;
  if (0.0 <= u) {
    fVar4 = u;
  }
  local_28 = 1.0;
  fVar3 = 1.0;
  if (fVar4 <= 1.0) {
    fVar3 = fVar4;
  }
  if (fVar3 < 1.0) {
    local_28 = 0.0;
    for (uVar1 = 0; (1e-05 < ABS(fVar3) && (uVar1 < 0x1e)); uVar1 = uVar1 + 1) {
      local_28 = local_28 +
                 (float)(int)((uint)(0.0 < fVar3) - (uint)(fVar3 < 0.0)) /
                 (float)(2 << ((byte)uVar1 & 0x1f));
      fVar2 = cdf2(this,local_28,qf1,zi);
      fVar3 = u - fVar2;
    }
  }
  return local_28;
}

Assistant:

float_t tab_r::qf2(float_t u, float_t qf1, float_t zi) const
{
	const float_t epsilon = 1e-5;
	float_t u2 = 0, delta = sat(u);
	int32_t level = 0;

	if (delta >= 1) return 1;

	while (fabs(delta) > epsilon && level < 30) {
		u2+= (float_t)sgn(delta) / (2 << level);
		delta = u - cdf2(u2, qf1, zi);
		++level;
	}

	return u2;
}